

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::UnknownFieldSerializerLite
               (uint8_t *ptr,uint32_t offset,uint32_t param_3,uint32_t param_4,
               CodedOutputStream *output)

{
  string *str;
  
  if ((*(ulong *)(ptr + offset) & 1) == 0) {
    InitProtobufDefaults();
    str = (string *)&fixed_address_empty_string_abi_cxx11_;
  }
  else {
    str = (string *)((*(ulong *)(ptr + offset) & 0xfffffffffffffffc) + 8);
  }
  io::CodedOutputStream::WriteString(output,str);
  return;
}

Assistant:

void UnknownFieldSerializerLite(const uint8_t* ptr, uint32_t offset,
                                uint32_t /*tag*/, uint32_t /*has_offset*/,
                                io::CodedOutputStream* output) {
  output->WriteString(
      reinterpret_cast<const InternalMetadata*>(ptr + offset)
          ->unknown_fields<std::string>(&internal::GetEmptyString));
}